

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Identifier.h
# Opt level: O3

IdentifierPath * __thiscall
soul::IdentifierPath::operator+
          (IdentifierPath *__return_storage_ptr__,IdentifierPath *this,IdentifierPath *other)

{
  size_t sVar1;
  Identifier *pIVar2;
  long lVar3;
  
  ArrayWithPreallocation<soul::Identifier,_8UL>::ArrayWithPreallocation
            (&__return_storage_ptr__->pathSections,&this->pathSections);
  sVar1 = (other->pathSections).numActive;
  if (sVar1 != 0) {
    pIVar2 = (other->pathSections).items;
    lVar3 = 0;
    do {
      addSuffix(__return_storage_ptr__,*(string **)((long)&pIVar2->name + lVar3));
      lVar3 = lVar3 + 8;
    } while (sVar1 << 3 != lVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

IdentifierPath operator+ (const IdentifierPath& other) const
    {
        IdentifierPath result (*this);

        for (auto i : other.pathSections)
            result.addSuffix (i);

        return result;
    }